

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_encoder_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::tools::HexEncoderTest_test_encode_as_hex_Test::TestBody
          (HexEncoderTest_test_encode_as_hex_Test *this)

{
  char *pcVar1;
  AssertHelper AStack_48;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  pcVar1 = "";
  bidfx_public_api::tools::HexEncoder::EncodeAsHex_abi_cxx11_((uchar *)&local_30,0x1e1d44);
  testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"\"","HexEncoder::EncodeAsHex((unsigned char *) \"\", 0)",
             (char (*) [1])0x1e1d44,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_30);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/hex_encoder_test.cpp"
               ,0x1a,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_48,(Message *)&local_30);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    bidfx_public_api::tools::HexEncoder::EncodeAsHex_abi_cxx11_((uchar *)&local_30,0x21ced1);
    testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
              ((internal *)&gtest_ar,"\"3a\"","HexEncoder::EncodeAsHex((unsigned char *) \":\", 1)",
               (char (*) [3])"3a",&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_30);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&AStack_48,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/hex_encoder_test.cpp"
                 ,0x1b,pcVar1);
      testing::internal::AssertHelper::operator=(&AStack_48,(Message *)&local_30);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      bidfx_public_api::tools::HexEncoder::EncodeAsHex_abi_cxx11_((uchar *)&local_30,0x1f21da);
      testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
                ((internal *)&gtest_ar,"\"60\"",
                 "HexEncoder::EncodeAsHex((unsigned char *) \"`\", 1)",(char (*) [3])"60",&local_30)
      ;
      std::__cxx11::string::~string((string *)&local_30);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_30);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar1 = "";
        }
        else {
          pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&AStack_48,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/hex_encoder_test.cpp"
                   ,0x1c,pcVar1);
        testing::internal::AssertHelper::operator=(&AStack_48,(Message *)&local_30);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        bidfx_public_api::tools::HexEncoder::EncodeAsHex_abi_cxx11_((uchar *)&local_30,0x1f219e);
        testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
                  ((internal *)&gtest_ar,"\"61\"",
                   "HexEncoder::EncodeAsHex((unsigned char *) \"a\", 1)",(char (*) [3])"61",
                   &local_30);
        std::__cxx11::string::~string((string *)&local_30);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_30);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar1 = "";
          }
          else {
            pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&AStack_48,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/hex_encoder_test.cpp"
                     ,0x1d,pcVar1);
          testing::internal::AssertHelper::operator=(&AStack_48,(Message *)&local_30);
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          bidfx_public_api::tools::HexEncoder::EncodeAsHex_abi_cxx11_((uchar *)&local_30,0x1fbb36);
          testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
                    ((internal *)&gtest_ar,"\"5d\"",
                     "HexEncoder::EncodeAsHex((unsigned char *) \"]\", 1)",(char (*) [3])"5d",
                     &local_30);
          std::__cxx11::string::~string((string *)&local_30);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&local_30);
            if (gtest_ar.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar1 = "";
            }
            else {
              pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&AStack_48,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/hex_encoder_test.cpp"
                       ,0x1e,pcVar1);
            testing::internal::AssertHelper::operator=(&AStack_48,(Message *)&local_30);
          }
          else {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr(&gtest_ar.message_);
            bidfx_public_api::tools::HexEncoder::EncodeAsHex_abi_cxx11_((uchar *)&local_30,0x1f22d9)
            ;
            testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
                      ((internal *)&gtest_ar,"\"7b\"",
                       "HexEncoder::EncodeAsHex((unsigned char *) \"{\", 1)",(char (*) [3])0x1f22d2,
                       &local_30);
            std::__cxx11::string::~string((string *)&local_30);
            if (gtest_ar.success_ != false) {
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar.message_);
              bidfx_public_api::tools::HexEncoder::EncodeAsHex_abi_cxx11_
                        ((uchar *)&local_30,0x1f22d5);
              testing::internal::CmpHelperEQ<char[11],std::__cxx11::string>
                        ((internal *)&gtest_ar,"\"3a60615d7b\"",
                         "HexEncoder::EncodeAsHex((unsigned char *) \":`a]{\", 5)",
                         (char (*) [11])"3a60615d7b",&local_30);
              std::__cxx11::string::~string((string *)&local_30);
              if (gtest_ar.success_ == false) {
                testing::Message::Message((Message *)&local_30);
                if (gtest_ar.message_.ptr_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar1 = "";
                }
                else {
                  pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&AStack_48,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/hex_encoder_test.cpp"
                           ,0x20,pcVar1);
                testing::internal::AssertHelper::operator=(&AStack_48,(Message *)&local_30);
                testing::internal::AssertHelper::~AssertHelper(&AStack_48);
                testing::internal::
                scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_30);
              }
              goto LAB_00182a32;
            }
            testing::Message::Message((Message *)&local_30);
            if (gtest_ar.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar1 = "";
            }
            else {
              pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&AStack_48,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/hex_encoder_test.cpp"
                       ,0x1f,pcVar1);
            testing::internal::AssertHelper::operator=(&AStack_48,(Message *)&local_30);
          }
        }
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&AStack_48);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_30);
LAB_00182a32:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(HexEncoderTest, test_encode_as_hex)
{
    ASSERT_EQ("", HexEncoder::EncodeAsHex((unsigned char *) "", 0));
    ASSERT_EQ("3a", HexEncoder::EncodeAsHex((unsigned char *) ":", 1));
    ASSERT_EQ("60", HexEncoder::EncodeAsHex((unsigned char *) "`", 1));
    ASSERT_EQ("61", HexEncoder::EncodeAsHex((unsigned char *) "a", 1));
    ASSERT_EQ("5d", HexEncoder::EncodeAsHex((unsigned char *) "]", 1));
    ASSERT_EQ("7b", HexEncoder::EncodeAsHex((unsigned char *) "{", 1));
    ASSERT_EQ("3a60615d7b", HexEncoder::EncodeAsHex((unsigned char *) ":`a]{", 5));
}